

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTimer.h
# Opt level: O1

void __thiscall HighsTimer::stop(HighsTimer *this,HighsInt i_clock)

{
  int *piVar1;
  pointer pdVar2;
  long lVar3;
  
  if (0.0 < (this->clock_start).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[i_clock]) {
    printf("Clock %d - %s - not running\n",(ulong)(uint)i_clock,
           (this->clock_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[i_clock]._M_dataplus._M_p);
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  pdVar2 = (this->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[i_clock] =
       (this->clock_start).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[i_clock] + (double)lVar3 / 1000000000.0 + pdVar2[i_clock];
  piVar1 = (this->clock_num_call).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + i_clock;
  *piVar1 = *piVar1 + 1;
  if (i_clock == -0x2e) {
    printf("HighsTimer: stopping clock %d: %s\n",0xffffffd2,
           (this->clock_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-0x2e]._M_dataplus._M_p);
  }
  (this->clock_start).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[i_clock] = (double)lVar3 / 1000000000.0;
  return;
}

Assistant:

void stop(const HighsInt i_clock = 0  //!< Index of the clock to be stopped
  ) {
    assert(i_clock >= 0);
    assert(i_clock < num_clock);
    // Check that the clock's been started. It should be set to
    // -getWallTime() <= 0
    const bool clock_stopped = clock_start[i_clock] > 0;
    if (clock_stopped) {
      printf("Clock %d - %s - not running\n", int(i_clock),
             clock_names[i_clock].c_str());
    }
    assert(!clock_stopped);
    double wall_time = getWallTime();
    double callClockTimes = wall_time + clock_start[i_clock];
    clock_time[i_clock] += callClockTimes;
    clock_num_call[i_clock]++;
    // Set the start to be the WallTick to check that the clock's been
    // stopped when it's next started
    if (i_clock == check_clock) {
      printf("HighsTimer: stopping clock %d: %s\n", int(check_clock),
             this->clock_names[check_clock].c_str());
    }
    clock_start[i_clock] = wall_time;
  }